

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RegistrarForTagAliases::RegistrarForTagAliases
          (RegistrarForTagAliases *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  IMutableRegistryHub *pIVar1;
  undefined8 in_RCX;
  char *in_RDX;
  char *in_RSI;
  long in_FS_OFFSET;
  allocator local_76;
  allocator local_75 [13];
  undefined8 local_68;
  char *local_60;
  char *local_58;
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = in_RCX;
  local_60 = in_RDX;
  local_58 = in_RSI;
  pIVar1 = getMutableRegistryHub();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,local_58,local_75);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,local_60,&local_76);
  (*pIVar1->_vptr_IMutableRegistryHub[6])(pIVar1,local_28,local_48,local_68);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_76);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)local_75);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RegistrarForTagAliases::RegistrarForTagAliases(char const* alias, char const* tag, SourceLineInfo const& lineInfo) {
        CATCH_TRY {
            getMutableRegistryHub().registerTagAlias(alias, tag, lineInfo);
        }